

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined4 *returnvalue;
  long *returnvalue_00;
  long *returnvalue_01;
  long *returnvalue_02;
  void *pvVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  N_Vector qB;
  N_Vector qB_00;
  int iVar7;
  int retval;
  int indexB;
  N_Vector local_b0;
  SUNContext ctx;
  N_Vector local_a0;
  long *local_98;
  sunrealtype time;
  void *local_88;
  long *local_80;
  void *local_78;
  undefined8 local_70;
  int ncheck;
  void *local_60;
  undefined8 local_58;
  void *local_50;
  void *local_48;
  long *local_40;
  void *local_38;
  
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("-------------------------------------------------\n");
  puts("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0");
  puts("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0");
  puts("               y1  +  y2  +  y3 = 0\n");
  puts("Find dG/dp for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  retval = SUNContext_Create(0,&ctx);
  iVar7 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    returnvalue = (undefined4 *)malloc(0x18);
    iVar3 = check_retval(returnvalue,"malloc",2);
    if (iVar3 == 0) {
      *returnvalue = 0x47ae147b;
      returnvalue[1] = 0x3fa47ae1;
      returnvalue[2] = 0;
      returnvalue[3] = 0x40c38800;
      *(undefined8 *)(returnvalue + 4) = 0x417c9c3800000000;
      returnvalue_00 = (long *)N_VNew_Serial(3,ctx);
      iVar3 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        puVar1 = *(undefined8 **)(*returnvalue_00 + 0x10);
        *puVar1 = 0x3ff0000000000000;
        puVar1[1] = 0;
        puVar1[2] = 0;
        returnvalue_01 = (long *)N_VClone(returnvalue_00);
        iVar3 = check_retval(returnvalue_01,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          puVar2 = *(undefined4 **)(*returnvalue_01 + 0x10);
          *puVar2 = 0x47ae147b;
          puVar2[1] = 0xbfa47ae1;
          puVar2[2] = 0x47ae147b;
          puVar2[3] = 0x3fa47ae1;
          *(undefined8 *)(puVar2 + 4) = 0;
          returnvalue_02 = (long *)N_VNew_Serial(1,ctx);
          iVar3 = check_retval(returnvalue_02,"N_VNew_Serial",0);
          if (iVar3 == 0) {
            **(undefined8 **)(*returnvalue_02 + 0x10) = 0;
            local_80 = returnvalue_02;
            puts("Create and allocate IDAS memory for forward runs");
            pvVar4 = (void *)IDACreate(ctx);
            local_38 = pvVar4;
            iVar3 = check_retval(pvVar4,"IDACreate",0);
            if (iVar3 == 0) {
              retval = IDAInit(0,pvVar4,res,returnvalue_00,returnvalue_01);
              iVar7 = 1;
              iVar3 = check_retval(&retval,"IDAInit",1);
              if (iVar3 == 0) {
                retval = IDAWFtolerances(pvVar4,ewt);
                iVar7 = 1;
                iVar3 = check_retval(&retval,"IDAWFtolerances",1);
                if (iVar3 == 0) {
                  local_88 = pvVar4;
                  retval = IDASetUserData(pvVar4,returnvalue);
                  iVar7 = 1;
                  iVar3 = check_retval(&retval,"IDASetUserData",1);
                  if (iVar3 == 0) {
                    pvVar4 = (void *)SUNDenseMatrix(3,3,ctx);
                    iVar3 = check_retval(pvVar4,"SUNDenseMatrix",0);
                    if (iVar3 == 0) {
                      local_48 = pvVar4;
                      local_50 = (void *)SUNLinSol_Dense(returnvalue_00,pvVar4,ctx);
                      iVar3 = check_retval(local_50,"SUNLinSol_Dense",0);
                      pvVar4 = local_88;
                      if (iVar3 == 0) {
                        retval = IDASetLinearSolver(local_88,local_50,local_48);
                        iVar7 = 1;
                        iVar3 = check_retval(&retval,"IDASetLinearSolver",1);
                        if (iVar3 == 0) {
                          retval = IDASetJacFn(pvVar4,Jac);
                          iVar7 = 1;
                          iVar3 = check_retval(&retval,"IDASetJacFn",1);
                          if (iVar3 == 0) {
                            retval = IDAQuadInit(pvVar4,rhsQ,local_80);
                            iVar7 = 1;
                            iVar3 = check_retval(&retval,"IDAQuadInit",1);
                            if (iVar3 == 0) {
                              retval = IDAQuadSStolerances(0xa0b5ed8d,0xa0b5ed8d,pvVar4);
                              iVar7 = 1;
                              iVar3 = check_retval(&retval,"IDAQuadSStolerances",1);
                              if (iVar3 == 0) {
                                iVar7 = 1;
                                retval = IDASetQuadErrCon(pvVar4,1);
                                iVar3 = check_retval(&retval,"IDASetQuadErrCon",1);
                                if (iVar3 == 0) {
                                  retval = IDASetMaxNumSteps(pvVar4,0x9c4);
                                  iVar7 = 1;
                                  iVar3 = check_retval(&retval,"IDASetMaxNumSteps",1);
                                  if (iVar3 == 0) {
                                    iVar7 = 1;
                                    retval = IDAAdjInit(pvVar4,100,1);
                                    iVar3 = check_retval(&retval,"IDAAdjInit",1);
                                    if (iVar3 == 0) {
                                      puts("Forward integration ...");
                                      iVar7 = 1;
                                      retval = IDASolveF(0,pvVar4,&time,returnvalue_00,
                                                         returnvalue_01,1,&ncheck);
                                      iVar3 = check_retval(&retval,"IDASolveF",1);
                                      if (iVar3 == 0) {
                                        uVar5 = N_VClone(returnvalue_00);
                                        local_70 = N_VClone(returnvalue_01);
                                        local_58 = uVar5;
                                        N_VScale(0,returnvalue_00,uVar5);
                                        N_VScale(0,returnvalue_01,local_70);
                                        iVar7 = 1;
                                        retval = IDASolveF(0x20000000,pvVar4,&time,returnvalue_00,
                                                           returnvalue_01,1,&ncheck);
                                        iVar3 = check_retval(&retval,"IDASolveF",1);
                                        if (iVar3 == 0) {
                                          retval = IDAGetQuad(pvVar4,&time,local_80);
                                          iVar7 = 1;
                                          iVar3 = check_retval(&retval,"IDAGetQuad",1);
                                          if (iVar3 == 0) {
                                            puts(
                                                "--------------------------------------------------------"
                                                );
                                            printf("G:          %12.4e \n",
                                                   (int)**(undefined8 **)(*local_80 + 0x10));
                                            puts(
                                                "--------------------------------------------------------"
                                                );
                                            puts("\nFinal Statistics:");
                                            retval = IDAPrintAllStats(pvVar4,_stdout,0);
                                            pFVar6 = fopen("idasRoberts_ASAi_dns_fwd_stats.csv","w")
                                            ;
                                            iVar7 = 1;
                                            retval = IDAPrintAllStats(pvVar4,pFVar6,1);
                                            fclose(pFVar6);
                                            local_b0 = (N_Vector)N_VClone(returnvalue_00);
                                            iVar3 = check_retval(local_b0,"N_VNew_Serial",0);
                                            if (iVar3 == 0) {
                                              puVar1 = *(undefined8 **)
                                                        ((long)local_b0->content + 0x10);
                                              *puVar1 = 0;
                                              puVar1[1] = 0;
                                              puVar1[2] = 0x3ff0000000000000;
                                              local_98 = (long *)N_VClone(returnvalue_00);
                                              iVar3 = check_retval(local_98,"N_VNew_Serial",0);
                                              pvVar4 = local_88;
                                              if (iVar3 == 0) {
                                                puVar1 = *(undefined8 **)(*local_98 + 0x10);
                                                *puVar1 = 0x3ff0000000000000;
                                                puVar1[1] = 0x3ff0000000000000;
                                                puVar1[2] = 0;
                                                puts(
                                                  "\nCreate and allocate IDAS memory for backward run"
                                                  );
                                                retval = IDACreateB(pvVar4,&indexB);
                                                iVar7 = 1;
                                                iVar3 = check_retval(&retval,"IDACreateB",1);
                                                if (iVar3 == 0) {
                                                  retval = IDAInitB(0x20000000,pvVar4,indexB,resB,
                                                                    local_b0,local_98);
                                                  iVar7 = 1;
                                                  iVar3 = check_retval(&retval,"IDAInitB",1);
                                                  if (iVar3 == 0) {
                                                    retval = IDASStolerancesB(0xa0b5ed8d,0xe2308c3a,
                                                                              pvVar4,indexB);
                                                    iVar7 = 1;
                                                    iVar3 = check_retval(&retval,"IDASStolerancesB",
                                                                         1);
                                                    if (iVar3 == 0) {
                                                      retval = IDASetUserDataB(pvVar4,indexB,
                                                                               returnvalue);
                                                      iVar7 = 1;
                                                      iVar3 = check_retval(&retval,"IDASetUserDataB"
                                                                           ,1);
                                                      if (iVar3 == 0) {
                                                        retval = IDASetMaxNumStepsB(pvVar4,indexB,
                                                                                    1000);
                                                        iVar7 = 1;
                                                        iVar3 = check_retval(&retval,
                                                  "IDASetMaxNumStepsB",1);
                                                  if (iVar3 == 0) {
                                                    local_78 = (void *)SUNDenseMatrix(3,3,ctx);
                                                    iVar3 = check_retval(local_78,"SUNDenseMatrix",0
                                                                        );
                                                    if (iVar3 == 0) {
                                                      local_60 = (void *)SUNLinSol_Dense(local_b0,
                                                  local_78,ctx);
                                                  iVar3 = check_retval(local_60,"SUNLinSol_Dense",0)
                                                  ;
                                                  pvVar4 = local_88;
                                                  if (iVar3 == 0) {
                                                    retval = IDASetLinearSolverB(local_88,indexB,
                                                                                 local_60,local_78);
                                                    iVar7 = 1;
                                                    iVar3 = check_retval(&retval,
                                                  "IDASetLinearSolverB",1);
                                                  if (iVar3 == 0) {
                                                    retval = IDASetJacFnB(pvVar4,indexB,JacB);
                                                    iVar7 = 1;
                                                    iVar3 = check_retval(&retval,"IDASetJacFnB",1);
                                                    if (iVar3 == 0) {
                                                      local_a0 = (N_Vector)N_VNew_Serial(3,ctx);
                                                      iVar3 = check_retval(local_a0,"N_VNew",0);
                                                      pvVar4 = local_88;
                                                      if (iVar3 == 0) {
                                                        puVar1 = *(undefined8 **)
                                                                  ((long)local_a0->content + 0x10);
                                                        *puVar1 = 0;
                                                        puVar1[1] = 0;
                                                        puVar1[2] = 0;
                                                        retval = IDAQuadInitB(local_88,indexB,rhsQB)
                                                        ;
                                                        iVar7 = 1;
                                                        iVar3 = check_retval(&retval,"IDAQuadInitB",
                                                                             1);
                                                        if (iVar3 == 0) {
                                                          retval = IDAQuadSStolerancesB
                                                                             (0xa0b5ed8d,0xa0b5ed8d,
                                                                              pvVar4,indexB);
                                                          iVar7 = 1;
                                                          iVar3 = check_retval(&retval,
                                                  "IDAQuadSStolerancesB",1);
                                                  if (iVar3 == 0) {
                                                    iVar7 = 1;
                                                    retval = IDASetQuadErrConB(pvVar4,indexB,1);
                                                    iVar3 = check_retval(&retval,"IDASetQuadErrConB"
                                                                         ,1);
                                                    if (iVar3 == 0) {
                                                      puts("Backward integration ...");
                                                      iVar7 = 1;
                                                      retval = IDASolveB(0,pvVar4,1);
                                                      iVar3 = check_retval(&retval,"IDASolveB",1);
                                                      if (iVar3 == 0) {
                                                        retval = IDAGetB(pvVar4,indexB,&time,
                                                                         local_b0,local_98);
                                                        iVar7 = 1;
                                                        iVar3 = check_retval(&retval,"IDAGetB",1);
                                                        if (iVar3 == 0) {
                                                          retval = IDAGetQuadB(pvVar4,indexB,&time,
                                                                               local_a0);
                                                          iVar7 = 1;
                                                          iVar3 = check_retval(&retval,"IDAGetB",1);
                                                          if (iVar3 == 0) {
                                                            PrintOutput(40000000000.0,local_b0,
                                                                        local_a0,qB);
                                                            puts("\nFinal Statistics:");
                                                            uVar5 = IDAGetAdjIDABmem(pvVar4,indexB);
                                                            retval = IDAPrintAllStats(uVar5,_stdout,
                                                                                      0);
                                                            pFVar6 = fopen(
                                                  "idasRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar5 = IDAGetAdjIDABmem(pvVar4,indexB);
                                                  iVar7 = 1;
                                                  retval = IDAPrintAllStats(uVar5,pFVar6,1);
                                                  fclose(pFVar6);
                                                  puts(
                                                  "\nRe-initialize IDAS memory for backward run");
                                                  puVar1 = *(undefined8 **)
                                                            ((long)local_b0->content + 0x10);
                                                  *puVar1 = 0;
                                                  puVar1[1] = 0;
                                                  puVar1[2] = 0x3fe0000000000000;
                                                  puVar2 = *(undefined4 **)(*local_98 + 0x10);
                                                  *puVar2 = 0x9999999a;
                                                  puVar2[1] = 0x3fe99999;
                                                  puVar2[2] = 0;
                                                  puVar2[3] = 0x3fe80000;
                                                  *(undefined8 *)(puVar2 + 4) = 0;
                                                  puVar1 = *(undefined8 **)
                                                            ((long)local_a0->content + 0x10);
                                                  *puVar1 = 0;
                                                  puVar1[1] = 0;
                                                  puVar1[2] = 0;
                                                  retval = IDAReInitB(0,pvVar4,indexB);
                                                  iVar3 = check_retval(&retval,"IDAReInitB",1);
                                                  if (iVar3 == 0) {
                                                    retval = IDAQuadReInitB(pvVar4,indexB,local_a0);
                                                    iVar7 = 1;
                                                    iVar3 = check_retval(&retval,"IDAQuadReInitB",1)
                                                    ;
                                                    if (iVar3 == 0) {
                                                      local_40 = (long *)N_VClone(returnvalue_00);
                                                      puVar2 = *(undefined4 **)(*local_40 + 0x10);
                                                      *puVar2 = 0;
                                                      puVar2[1] = 0x3ff00000;
                                                      puVar2[2] = 0;
                                                      puVar2[3] = 0x3ff00000;
                                                      *(undefined8 *)(puVar2 + 4) = 0;
                                                      retval = IDASetIdB(pvVar4,indexB);
                                                      iVar7 = 1;
                                                      iVar3 = check_retval(&retval,"IDASetId",1);
                                                      if (iVar3 == 0) {
                                                        retval = IDACalcICB(0,pvVar4,indexB,local_58
                                                                            ,local_70);
                                                        iVar7 = 1;
                                                        iVar3 = check_retval(&retval,"IDACalcICB",1)
                                                        ;
                                                        if (iVar3 == 0) {
                                                          retval = IDAGetConsistentICB(pvVar4,indexB
                                                                                       ,local_b0,
                                                                                       local_98);
                                                          iVar7 = 1;
                                                          iVar3 = check_retval(&retval,
                                                  "IDAGetConsistentICB",1);
                                                  if (iVar3 == 0) {
                                                    iVar7 = 1;
                                                    retval = IDASolveB(0,pvVar4,1);
                                                    iVar3 = check_retval(&retval,"IDASolveB",1);
                                                    if (iVar3 == 0) {
                                                      retval = IDAGetB(pvVar4,indexB,&time,local_b0,
                                                                       local_98);
                                                      iVar7 = 1;
                                                      iVar3 = check_retval(&retval,"IDAGetB",1);
                                                      if (iVar3 == 0) {
                                                        retval = IDAGetQuadB(pvVar4,indexB,&time,
                                                                             local_a0);
                                                        iVar7 = 1;
                                                        iVar3 = check_retval(&retval,"IDAGetQuadB",1
                                                                            );
                                                        if (iVar3 == 0) {
                                                          PrintOutput(50.0,local_b0,local_a0,qB_00);
                                                          puts("\nFinal Statistics:");
                                                          uVar5 = IDAGetAdjIDABmem(pvVar4,indexB);
                                                          iVar7 = 0;
                                                          retval = IDAPrintAllStats(uVar5,_stdout,0)
                                                          ;
                                                          pFVar6 = fopen(
                                                  "idasRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar5 = IDAGetAdjIDABmem(pvVar4,indexB);
                                                  retval = IDAPrintAllStats(uVar5,pFVar6,1);
                                                  fclose(pFVar6);
                                                  IDAFree(&local_38);
                                                  SUNLinSolFree(local_50);
                                                  SUNMatDestroy(local_48);
                                                  SUNLinSolFree(local_60);
                                                  SUNMatDestroy(local_78);
                                                  N_VDestroy(returnvalue_00);
                                                  N_VDestroy(returnvalue_01);
                                                  N_VDestroy(local_80);
                                                  N_VDestroy(local_b0);
                                                  N_VDestroy(local_98);
                                                  N_VDestroy(local_a0);
                                                  N_VDestroy(local_40);
                                                  N_VDestroy(local_58);
                                                  N_VDestroy(local_70);
                                                  free(returnvalue);
                                                  SUNContext_Free(&ctx);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;

  UserData data;

  void* ida_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype reltolQ, abstolQ;
  N_Vector yy, yp, q;
  N_Vector yyTB1, ypTB1;
  N_Vector id;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, ypB, qB;
  sunrealtype time;
  int retval, ncheck;

  IDAadjCheckPointRec* ckpnt;

  FILE* FID;

  data    = NULL;
  ckpnt   = NULL;
  ida_mem = NULL;
  A = AB = NULL;
  LS = LSB = NULL;
  yy = yp = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Initialize y */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;

  /* Initialize yprime */
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  Ith(yp, 1) = SUN_RCONST(-0.04);
  Ith(yp, 2) = SUN_RCONST(0.04);
  Ith(yp, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLQ;

  /* Create and allocate IDAS memory for forward run */
  printf("Create and allocate IDAS memory for forward runs\n");

  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(ida_mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDAWFtolerances(ida_mem, ewt);
  if (check_retval(&retval, "IDAWFtolerances", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(ida_mem, Jac);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Setup quadrature integration */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  retval = IDAQuadSStolerances(ida_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Call IDASetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = IDASetMaxNumSteps(ida_mem, 2500);
  if (check_retval(&retval, "IDASetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  steps  = STEPS;
  retval = IDAAdjInit(ida_mem, steps, IDA_HERMITE);
  /*retval = IDAAdjInit(ida_mem, steps, IDA_POLYNOMIAL);*/
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ...\n");

  /* Integrate till TB1 and get the solution (y, y') at that time. */
  retval = IDASolveF(ida_mem, TB1, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  yyTB1 = N_VClone(yy);
  ypTB1 = N_VClone(yp);
  /* Save the states at t=TB1. */
  N_VScale(ONE, yy, yyTB1);
  N_VScale(ONE, yp, ypTB1);

  /* Continue integrating till TOUT is reached. */
  retval = IDASolveF(ida_mem, TOUT, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetQuad(ida_mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (IDAadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(IDAadjCheckPointRec));
    IDAGetAdjCheckPointsInfo(ida_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Create BACKWARD problem. */

  /* Allocate yB (i.e. lambda_0). */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize yB. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ONE;

  /* Allocate ypB (i.e. lambda'_0). */
  ypB = N_VClone(yy);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize ypB. */
  Ith(ypB, 1) = ONE;
  Ith(ypB, 2) = ONE;
  Ith(ypB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLA;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLQ;

  /* Create and allocate IDAS memory for backward run */
  printf("\nCreate and allocate IDAS memory for backward run\n");

  retval = IDACreateB(ida_mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(ida_mem, indexB, resB, TB2, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(ida_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(ida_mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(ida_mem, indexB, 1000);
  if (check_retval(&retval, "IDASetMaxNumStepsB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFnB(ida_mem, indexB, JacB);
  if (check_retval(&retval, "IDASetJacFnB", 1)) { return (1); }

  /* Quadrature for backward problem. */

  /* Initialize qB */
  qB = N_VNew_Serial(NP, ctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAQuadInitB(ida_mem, indexB, rhsQB, qB);
  if (check_retval(&retval, "IDAQuadInitB", 1)) { return (1); }

  retval = IDAQuadSStolerancesB(ida_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "IDAQuadSStolerancesB", 1)) { return (1); }

  /* Include quadratures in error control. */
  retval = IDASetQuadErrConB(ida_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrConB", 1)) { return (1); }

  /* Backward Integration */
  printf("Backward integration ...\n");

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(TB2, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase and start from a different time (TB1). */
  printf("\nRe-initialize IDAS memory for backward run\n");

  /* Both algebraic part from y and the entire y' are computed by IDACalcIC. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = SUN_RCONST(0.50); /* not consistent */

  /* Rough guess for ypB. */
  Ith(ypB, 1) = SUN_RCONST(0.80);
  Ith(ypB, 2) = SUN_RCONST(0.75);
  Ith(ypB, 3) = ZERO;

  /* Initialize qB */
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAReInitB(ida_mem, indexB, TB1, yB, ypB);
  if (check_retval(&retval, "IDAReInitB", 1)) { return (1); }

  /* Also reinitialize quadratures. */
  retval = IDAQuadReInitB(ida_mem, indexB, qB);
  if (check_retval(&retval, "IDAQuadReInitB", 1)) { return (1); }

  /* Use IDACalcICB to compute consistent initial conditions
     for this backward problem. */

  id         = N_VClone(yy);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;

  /* Specify which variables are differential (1) and which algebraic (0).*/
  retval = IDASetIdB(ida_mem, indexB, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDACalcICB(ida_mem, indexB, T1B, yyTB1, ypTB1);
  if (check_retval(&retval, "IDACalcICB", 1)) { return (1); }

  /* Get the consistent IC found by IDAS. */
  retval = IDAGetConsistentICB(ida_mem, indexB, yB, ypB);
  if (check_retval(&retval, "IDAGetConsistentICB", 1)) { return (1); }

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetQuadB", 1)) { return (1); }

  PrintOutput(TB1, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free any memory used.*/

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(qB);
  N_VDestroy(id);
  N_VDestroy(yyTB1);
  N_VDestroy(ypTB1);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}